

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

void __thiscall nonstd::any_lite::bad_any_cast::~bad_any_cast(bad_any_cast *this)

{
  bad_any_cast *this_local;
  
  ~bad_any_cast(this);
  operator_delete(this,8);
  return;
}

Assistant:

class any_nodiscard bad_any_cast : public std::bad_cast
{
public:
#if any_CPP11_OR_GREATER
    virtual const char* what() const any_noexcept any_override
#else
    virtual const char* what() const throw()
#endif
   {
      return "any-lite: bad any_cast";
   }
}